

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexerHelper.cxx
# Opt level: O1

bool __thiscall
cmCTestResourceGroupsLexerHelper::ParseString(cmCTestResourceGroupsLexerHelper *this,string *value)

{
  int iVar1;
  YY_BUFFER_STATE b;
  yyscan_t lexer;
  yyscan_t local_20;
  
  cmCTestResourceGroups_yylex_init_extra(this,&local_20);
  b = cmCTestResourceGroups_yy_scan_string((value->_M_dataplus)._M_p,local_20);
  iVar1 = cmCTestResourceGroups_yylex(local_20);
  cmCTestResourceGroups_yy_delete_buffer(b,local_20);
  cmCTestResourceGroups_yylex_destroy(local_20);
  return iVar1 == 0;
}

Assistant:

bool cmCTestResourceGroupsLexerHelper::ParseString(const std::string& value)
{
  yyscan_t lexer;
  cmCTestResourceGroups_yylex_init_extra(this, &lexer);

  auto* state = cmCTestResourceGroups_yy_scan_string(value.c_str(), lexer);
  int retval = cmCTestResourceGroups_yylex(lexer);
  cmCTestResourceGroups_yy_delete_buffer(state, lexer);

  cmCTestResourceGroups_yylex_destroy(lexer);
  return retval == 0;
}